

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nng.c
# Opt level: O2

void nng_socket_send(nng_socket s,nng_aio *aio)

{
  nng_err result;
  nni_msg *pnVar1;
  nni_sock *local_20;
  nni_sock *sock;
  
  nni_aio_reset(aio);
  pnVar1 = nni_aio_get_msg(aio);
  if (pnVar1 != (nni_msg *)0x0) {
    result = nni_sock_find(&local_20,s.id);
    if (result == NNG_OK) {
      nni_sock_send(local_20,aio);
      nni_sock_rele(local_20);
    }
    else {
      nni_aio_finish_error(aio,result);
    }
    return;
  }
  nni_aio_finish_error(aio,NNG_EINVAL);
  return;
}

Assistant:

void
nng_socket_send(nng_socket s, nng_aio *aio)
{
	nni_sock *sock;
	int       rv;

	nni_aio_reset(aio);
	if (nni_aio_get_msg(aio) == NULL) {
		nni_aio_finish_error(aio, NNG_EINVAL);
		return;
	}
	if ((rv = nni_sock_find(&sock, s.id)) != 0) {
		nni_aio_finish_error(aio, rv);
		return;
	}
	nni_sock_send(sock, aio);
	nni_sock_rele(sock);
}